

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emoticon.cpp
# Opt level: O1

void __thiscall CEmoticon::OnRender(CEmoticon *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CGameClient *pCVar3;
  CNetObj_GameData *pCVar4;
  IGraphics *pIVar5;
  int iVar6;
  CUIRect *pCVar7;
  long in_FS_OFFSET;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  float fVar12;
  vec2 vVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  CNetMsg_Cl_Emoticon Msg;
  float local_98;
  float fStack_94;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->super_CComponent).m_pClient;
  if (2 < pCVar3->m_pClient->m_State) {
    if (this->m_Active == false) {
      if ((this->m_WasActive == true) && (this->m_SelectedEmote != -1)) {
        local_40 = CONCAT44(local_40._4_4_,this->m_SelectedEmote);
        IClient::SendPackMsg<CNetMsg_Cl_Emoticon>
                  (pCVar3->m_pClient,(CNetMsg_Cl_Emoticon *)&local_40,1);
      }
      this->m_WasActive = false;
      goto LAB_00143f09;
    }
    if (((pCVar3->m_Snap).m_SpecInfo.m_Active == false) &&
       ((pCVar4 = (pCVar3->m_Snap).m_pGameData, pCVar4 == (CNetObj_GameData *)0x0 ||
        ((pCVar4->m_GameStateFlags & 8) == 0)))) {
      this->m_WasActive = true;
      fVar8 = (this->m_SelectorMouse).field_0.x;
      fVar12 = (this->m_SelectorMouse).field_1.y;
      fVar8 = fVar8 * fVar8 + fVar12 * fVar12;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      if (170.0 < fVar8) {
        fVar8 = (this->m_SelectorMouse).field_0.x;
        uVar11 = 0;
        fVar12 = (this->m_SelectorMouse).field_1.y;
        fVar8 = fVar8 * fVar8 + fVar12 * fVar12;
        if (fVar8 < 0.0) {
          fVar8 = sqrtf(fVar8);
          uVar11 = extraout_XMM0_Db;
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        auVar14._8_8_ = 0;
        auVar14._0_4_ = (this->m_SelectorMouse).field_0;
        auVar14._4_4_ = (this->m_SelectorMouse).field_1;
        auVar15._4_4_ = fVar8;
        auVar15._0_4_ = fVar8;
        auVar15._8_4_ = uVar11;
        auVar15._12_4_ = uVar11;
        auVar15 = divps(auVar14,auVar15);
        vVar13.field_0.x = auVar15._0_4_ * 170.0;
        vVar13.field_1.y = auVar15._4_4_ * 170.0;
        this->m_SelectorMouse = vVar13;
      }
      fVar9 = atan2f((this->m_SelectorMouse).field_1.y,(this->m_SelectorMouse).field_0.x);
      fVar8 = (this->m_SelectorMouse).field_0.x;
      fVar12 = (this->m_SelectorMouse).field_1.y;
      fVar8 = fVar8 * fVar8 + fVar12 * fVar12;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      iVar6 = -1;
      if (110.0 < fVar8) {
        fVar9 = fVar9 + 0.2617994;
        iVar6 = (int)(((float)(~-(uint)(fVar9 < 0.0) & (uint)fVar9 |
                              (uint)(fVar9 + 6.2831855) & -(uint)(fVar9 < 0.0)) / 6.2831855) * 16.0)
        ;
      }
      this->m_SelectedEmote = iVar6;
      pCVar7 = CUI::Screen(&((this->super_CComponent).m_pClient)->m_UI);
      uVar1 = pCVar7->w;
      uVar2 = pCVar7->h;
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[5])
                (pCVar7->x);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])()
      ;
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,0xffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17]
      )();
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21]
      )(0);
      fVar8 = (float)uVar1 * 0.5;
      fVar12 = (float)uVar2 * 0.5;
      DrawCircle(this,fVar8,fVar12,190.0,0x40);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18]
      )();
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])
                (pIVar5,(ulong)(uint)g_pData->m_aImages[6].m_Id.m_Id);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17]
      )();
      iVar6 = 0;
      do {
        fVar9 = (float)iVar6 * 6.2831855 * 0.0625;
        fVar9 = (float)(~-(uint)(3.1415927 < fVar9) & (uint)fVar9 |
                       (uint)(fVar9 + -6.2831855) & -(uint)(3.1415927 < fVar9));
        uVar11 = *(undefined4 *)(&DAT_001dba30 + (ulong)(this->m_SelectedEmote == iVar6) * 4);
        fVar10 = cosf(fVar9);
        fVar9 = sinf(fVar9);
        CRenderTools::SelectSprite
                  (&((this->super_CComponent).m_pClient)->m_RenderTools,iVar6 + 0x5c,0,0,0);
        local_40 = CONCAT44(fVar9 * 150.0 + fVar12,fVar10 * 150.0 + fVar8);
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        local_38 = uVar11;
        local_34 = uVar11;
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_40,1);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0x10);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18]
      )();
      CRenderTools::RenderCursor
                (&((this->super_CComponent).m_pClient)->m_RenderTools,
                 (this->m_SelectorMouse).field_0.x + fVar8,
                 (this->m_SelectorMouse).field_1.y + fVar12,24.0);
      goto LAB_00143f09;
    }
  }
  this->m_WasActive = false;
  this->m_Active = false;
LAB_00143f09:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEmoticon::OnRender()
{
	if(Client()->State() < IClient::STATE_ONLINE)
	{
		m_Active = false;
		m_WasActive = false;
		return;
	}

	if(!m_Active)
	{
		if(m_WasActive && m_SelectedEmote != -1)
			Emote(m_SelectedEmote);
		m_WasActive = false;
		return;
	}

	if(m_pClient->m_Snap.m_SpecInfo.m_Active || (m_pClient->m_Snap.m_pGameData && m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_GAMEOVER))
	{
		m_Active = false;
		m_WasActive = false;
		return;
	}

	m_WasActive = true;

	if (length(m_SelectorMouse) > 170.0f)
		m_SelectorMouse = normalize(m_SelectorMouse) * 170.0f;

	float SelectedAngle = angle(m_SelectorMouse) + 2*pi/24;
	if (SelectedAngle < 0)
		SelectedAngle += 2*pi;

	if (length(m_SelectorMouse) > 110.0f)
		m_SelectedEmote = (int)(SelectedAngle / (2*pi) * NUM_EMOTICONS);
	else
		m_SelectedEmote = -1;

	CUIRect Screen = *UI()->Screen();

	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);

	Graphics()->BlendNormal();

	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	Graphics()->SetColor(0,0,0,0.3f);
	DrawCircle(Screen.w/2, Screen.h/2, 190.0f, 64);
	Graphics()->QuadsEnd();

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_EMOTICONS].m_Id);
	Graphics()->QuadsBegin();

	for (int i = 0; i < NUM_EMOTICONS; i++)
	{
		float Angle = 2*pi*i/NUM_EMOTICONS;
		if (Angle > pi)
			Angle -= 2*pi;

		bool Selected = m_SelectedEmote == i;

		float Size = Selected ? 80.0f : 50.0f;

		float NudgeX = 150.0f * cosf(Angle);
		float NudgeY = 150.0f * sinf(Angle);
		RenderTools()->SelectSprite(SPRITE_OOP + i);
		IGraphics::CQuadItem QuadItem(Screen.w/2 + NudgeX, Screen.h/2 + NudgeY, Size, Size);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	Graphics()->QuadsEnd();

	RenderTools()->RenderCursor(m_SelectorMouse.x + Screen.w/2, m_SelectorMouse.y + Screen.h/2, 24.0f);
}